

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::OutputFile::copyPixels(OutputFile *this,InputFile *in)

{
  LineOrder LVar1;
  Compression CVar2;
  OutputStreamMutex *filedata;
  int iVar3;
  bool bVar4;
  int iVar5;
  Header *this_00;
  ConstIterator CVar6;
  const_iterator cVar7;
  Box2i *pBVar8;
  Box2i *src;
  LineOrder *pLVar9;
  Compression *pCVar10;
  ChannelList *this_01;
  ChannelList *other;
  ArgExc *pAVar11;
  ostream *poVar12;
  char *pcVar13;
  LogicExc *this_02;
  Data *pDVar14;
  int pixelDataSize;
  Lock local_1c8;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  local_1c8._mutex = &this->_data->_streamData->super_Mutex;
  std::mutex::lock(local_1c8._mutex);
  local_1c8._locked = true;
  pDVar14 = this->_data;
  this_00 = InputFile::header(in);
  CVar6 = Header::find(this_00,"tiles");
  cVar7._M_node = (_Base_ptr)Header::end(this_00);
  if (CVar6._i._M_node != (const_iterator)cVar7._M_node) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar12 = std::operator<<(local_1a8,"Cannot copy pixels from image file \"");
    pcVar13 = InputFile::fileName(in);
    poVar12 = std::operator<<(poVar12,pcVar13);
    poVar12 = std::operator<<(poVar12,"\" to image file \"");
    pcVar13 = fileName(this);
    poVar12 = std::operator<<(poVar12,pcVar13);
    std::operator<<(poVar12,
                    "\". The input file is tiled, but the output file is not. Try using TiledOutputFile::copyPixels instead."
                   );
    pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pBVar8 = Header::dataWindow(&pDVar14->header);
  src = Header::dataWindow(this_00);
  bVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar8,src);
  if (!bVar4) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar12 = std::operator<<(local_1a8,"Cannot copy pixels from image file \"");
    pcVar13 = InputFile::fileName(in);
    poVar12 = std::operator<<(poVar12,pcVar13);
    poVar12 = std::operator<<(poVar12,"\" to image file \"");
    pcVar13 = fileName(this);
    poVar12 = std::operator<<(poVar12,pcVar13);
    std::operator<<(poVar12,"\". The files have different data windows.");
    pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pLVar9 = Header::lineOrder(&pDVar14->header);
  LVar1 = *pLVar9;
  pLVar9 = Header::lineOrder(this_00);
  if (LVar1 != *pLVar9) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar12 = std::operator<<(local_1a8,"Quick pixel copy from image file \"");
    pcVar13 = InputFile::fileName(in);
    poVar12 = std::operator<<(poVar12,pcVar13);
    poVar12 = std::operator<<(poVar12,"\" to image file \"");
    pcVar13 = fileName(this);
    poVar12 = std::operator<<(poVar12,pcVar13);
    std::operator<<(poVar12,"\" failed. The files have different line orders.");
    pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pCVar10 = Header::compression(&pDVar14->header);
  CVar2 = *pCVar10;
  pCVar10 = Header::compression(this_00);
  if (CVar2 == *pCVar10) {
    this_01 = Header::channels(&pDVar14->header);
    other = Header::channels(this_00);
    bVar4 = ChannelList::operator==(this_01,other);
    if (!bVar4) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar12 = std::operator<<(local_1a8,"Quick pixel copy from image file \"");
      pcVar13 = InputFile::fileName(in);
      poVar12 = std::operator<<(poVar12,pcVar13);
      poVar12 = std::operator<<(poVar12,"\" to image file \"");
      pcVar13 = fileName(this);
      poVar12 = std::operator<<(poVar12,pcVar13);
      std::operator<<(poVar12,"\" failed.  The files have different channel lists.");
      pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
      __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    pBVar8 = Header::dataWindow(&pDVar14->header);
    pDVar14 = this->_data;
    iVar5 = pDVar14->missingScanLines;
    if (iVar5 == ((pBVar8->max).y - (pBVar8->min).y) + 1) {
      while (0 < iVar5) {
        InputFile::rawPixelData(in,pDVar14->currentScanLine,(char **)&_iex_throw_s,&pixelDataSize);
        pDVar14 = this->_data;
        filedata = pDVar14->_streamData;
        iVar5 = lineBufferMinY(pDVar14->currentScanLine,pDVar14->minY,pDVar14->linesInBuffer);
        anon_unknown_7::writePixelData(filedata,pDVar14,iVar5,__iex_throw_s,pixelDataSize);
        pDVar14 = this->_data;
        iVar5 = pDVar14->linesInBuffer;
        iVar3 = -iVar5;
        if (pDVar14->lineOrder == INCREASING_Y) {
          iVar3 = iVar5;
        }
        pDVar14->currentScanLine = pDVar14->currentScanLine + iVar3;
        iVar5 = pDVar14->missingScanLines - iVar5;
        pDVar14->missingScanLines = iVar5;
      }
      IlmThread_2_5::Lock::~Lock(&local_1c8);
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar12 = std::operator<<(local_1a8,"Quick pixel copy from image file \"");
    pcVar13 = InputFile::fileName(in);
    poVar12 = std::operator<<(poVar12,pcVar13);
    poVar12 = std::operator<<(poVar12,"\" to image file \"");
    pcVar13 = fileName(this);
    poVar12 = std::operator<<(poVar12,pcVar13);
    poVar12 = std::operator<<(poVar12,"\" failed. \"");
    pcVar13 = fileName(this);
    poVar12 = std::operator<<(poVar12,pcVar13);
    std::operator<<(poVar12,"\" already contains pixel data.");
    this_02 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::LogicExc::LogicExc(this_02,(stringstream *)&_iex_throw_s);
    __cxa_throw(this_02,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar12 = std::operator<<(local_1a8,"Quick pixel copy from image file \"");
  pcVar13 = InputFile::fileName(in);
  poVar12 = std::operator<<(poVar12,pcVar13);
  poVar12 = std::operator<<(poVar12,"\" to image file \"");
  pcVar13 = fileName(this);
  poVar12 = std::operator<<(poVar12,pcVar13);
  std::operator<<(poVar12,"\" failed. The files use different compression methods.");
  pAVar11 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar11,(stringstream *)&_iex_throw_s);
  __cxa_throw(pAVar11,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void	
OutputFile::copyPixels (InputFile &in)
{
    Lock lock (*_data->_streamData);

    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header &hdr = _data->header;
    const Header &inHdr = in.header();

    if (inHdr.find("tiles") != inHdr.end())
	THROW (IEX_NAMESPACE::ArgExc, "Cannot copy pixels from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\". "
                            "The input file is tiled, but the output file is "
                            "not. Try using TiledOutputFile::copyPixels "
                            "instead.");

    if (!(hdr.dataWindow() == inHdr.dataWindow()))
	THROW (IEX_NAMESPACE::ArgExc, "Cannot copy pixels from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\". "
                            "The files have different data windows.");

    if (!(hdr.lineOrder() == inHdr.lineOrder()))
	THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed. "
			    "The files have different line orders.");

    if (!(hdr.compression() == inHdr.compression()))
	THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed. "
			    "The files use different compression methods.");

    if (!(hdr.channels() == inHdr.channels()))
	THROW (IEX_NAMESPACE::ArgExc, "Quick pixel copy from image "
			    "file \"" << in.fileName() << "\" to image "
			    "file \"" << fileName() << "\" failed.  "
			    "The files have different channel lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    const Box2i &dataWindow = hdr.dataWindow();

    if (_data->missingScanLines != dataWindow.max.y - dataWindow.min.y + 1)
	THROW (IEX_NAMESPACE::LogicExc, "Quick pixel copy from image "
			      "file \"" << in.fileName() << "\" to image "
			      "file \"" << fileName() << "\" failed. "
			      "\"" << fileName() << "\" already contains "
			      "pixel data.");

    //
    // Copy the pixel data.
    //

    while (_data->missingScanLines > 0)
    {
	const char *pixelData;
	int pixelDataSize;

	in.rawPixelData (_data->currentScanLine, pixelData, pixelDataSize);

        writePixelData (_data->_streamData, _data, lineBufferMinY (_data->currentScanLine,
                                               _data->minY,
                                               _data->linesInBuffer),
                        pixelData, pixelDataSize);

	_data->currentScanLine += (_data->lineOrder == INCREASING_Y)?
				   _data->linesInBuffer: -_data->linesInBuffer;

	_data->missingScanLines -= _data->linesInBuffer;
    }
}